

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O0

void ImGui::Scrollbar(ImGuiAxis axis)

{
  ImGuiWindow *window_00;
  ImDrawList *this;
  ImGuiContext *pIVar1;
  ImGuiID id_00;
  ImU32 col;
  uint uVar2;
  bool bVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  ImGuiCol local_14c;
  ImVec2 *local_148;
  float local_138;
  float local_134;
  float local_130;
  float local_12c;
  float local_108;
  float local_100;
  byte local_f9;
  ImRect local_f8;
  ImRect local_e8;
  undefined1 local_d8 [8];
  ImRect grab_rect;
  ImU32 grab_col;
  float scroll_v_norm;
  bool seek_absolute;
  float clicked_v_norm;
  float *click_delta_to_grab_center_v;
  float mouse_pos_v;
  float scrollbar_pos_v;
  float grab_v_norm;
  float scroll_ratio;
  float scroll_max;
  bool previously_held;
  bool hovered;
  float fStack_94;
  bool held;
  float grab_h_norm;
  float grab_h_pixels;
  float win_size_v;
  float win_size_contents_v;
  float win_size_avail_v;
  float scroll_v;
  float scrollbar_size_v;
  uint local_74;
  byte local_6d;
  int window_rounding_corners;
  float fStack_68;
  bool allow_interaction;
  float alpha;
  float bb_height;
  float bb_width;
  ImRect bb;
  float border_size;
  ImRect host_rect;
  float other_scrollbar_size_w;
  bool other_scrollbar;
  ImGuiID id;
  ImGuiStyle *style;
  bool horizontal;
  ImGuiWindow *window;
  ImGuiContext *g;
  ImGuiAxis axis_local;
  
  pIVar1 = GImGui;
  window_00 = GImGui->CurrentWindow;
  bVar3 = axis != ImGuiAxis_X;
  id_00 = GetScrollbarID(window_00,axis);
  KeepAliveID(id_00);
  if (bVar3) {
    local_f9 = window_00->ScrollbarX;
  }
  else {
    local_f9 = window_00->ScrollbarY;
  }
  local_f9 = local_f9 & 1;
  if (local_f9 == 0) {
    local_100 = 0.0;
  }
  else {
    local_100 = (pIVar1->Style).ScrollbarSize;
  }
  join_0x00001240_0x00001200_ = ImGuiWindow::Rect(window_00);
  bb.Max.x = window_00->WindowBorderSize;
  if (bVar3) {
    ImRect::ImRect((ImRect *)&bb_height,host_rect.Min.x - (pIVar1->Style).ScrollbarSize,
                   border_size + bb.Max.x,host_rect.Min.x - bb.Max.x,
                   (host_rect.Min.y - local_100) - bb.Max.x);
  }
  else {
    ImRect::ImRect((ImRect *)&bb_height,bb.Max.y + bb.Max.x,
                   host_rect.Min.y - (pIVar1->Style).ScrollbarSize,
                   (host_rect.Min.x - local_100) - bb.Max.x,host_rect.Min.y - bb.Max.x);
  }
  bb_height = ImMax<float>(bb.Max.y,bb_height);
  bb_width = ImMax<float>(border_size,bb_width);
  if (bVar3) {
    fVar5 = ImGuiWindow::TitleBarHeight(window_00);
    if ((window_00->Flags & 0x400U) == 0) {
      local_108 = 0.0;
    }
    else {
      local_108 = ImGuiWindow::MenuBarHeight(window_00);
    }
    bb_width = fVar5 + local_108 + bb_width;
  }
  alpha = ImRect::GetWidth((ImRect *)&bb_height);
  fStack_68 = ImRect::GetHeight((ImRect *)&bb_height);
  if (((0.0 < alpha) && (0.0 < fStack_68)) &&
     ((window_rounding_corners = 0x3f800000, axis != ImGuiAxis_Y ||
      ((fVar5 = (pIVar1->Style).FramePadding.y, fVar5 + fVar5 + pIVar1->FontSize <= fStack_68 ||
       (window_rounding_corners =
             (int)ImSaturate((fStack_68 - pIVar1->FontSize) / ((pIVar1->Style).FramePadding.y * 2.0)
                            ), 0.0 < (float)window_rounding_corners)))))) {
    local_6d = 1.0 <= (float)window_rounding_corners;
    if (bVar3) {
      bVar4 = false;
      if ((window_00->Flags & 1U) != 0) {
        bVar4 = (window_00->Flags & 0x400U) == 0;
      }
      local_74 = 0;
      if (bVar4) {
        local_74 = 2;
      }
      uVar2 = 8;
      if (local_f9 != 0) {
        uVar2 = 0;
      }
      local_74 = local_74 | uVar2;
    }
    else {
      local_74 = 8;
      if (local_f9 != 0) {
        local_74 = 0;
      }
      local_74 = local_74 | 4;
    }
    this = window_00->DrawList;
    col = GetColorU32(0xe,1.0);
    ImDrawList::AddRectFilled
              (this,(ImVec2 *)&bb_height,&bb.Min,col,window_00->WindowRounding,local_74);
    fVar5 = ImClamp<float>((float)(int)((alpha - 2.0) * 0.5),0.0,3.0);
    fVar6 = ImClamp<float>((float)(int)((fStack_68 - 2.0) * 0.5),0.0,3.0);
    ImVec2::ImVec2((ImVec2 *)&scroll_v,-fVar5,-fVar6);
    ImRect::Expand((ImRect *)&bb_height,(ImVec2 *)&scroll_v);
    if (bVar3) {
      local_12c = ImRect::GetHeight((ImRect *)&bb_height);
    }
    else {
      local_12c = ImRect::GetWidth((ImRect *)&bb_height);
    }
    win_size_avail_v = local_12c;
    if (bVar3) {
      local_130 = (window_00->Scroll).y;
    }
    else {
      local_130 = (window_00->Scroll).x;
    }
    win_size_contents_v = local_130;
    if (bVar3) {
      local_134 = (window_00->SizeFull).y;
    }
    else {
      local_134 = (window_00->SizeFull).x;
    }
    win_size_v = local_134 - local_100;
    if (bVar3) {
      local_138 = (window_00->SizeContents).y;
    }
    else {
      local_138 = (window_00->SizeContents).x;
    }
    grab_h_pixels = local_138;
    fVar5 = ImMax<float>(local_138,win_size_v);
    if (fVar5 <= 0.0) {
      __assert_fail("ImMax(win_size_contents_v, win_size_avail_v) > 0.0f",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/kidanger[P]vpe/imgui-1.70/imgui_widgets.cpp"
                    ,0x342,"void ImGui::Scrollbar(ImGuiAxis)");
    }
    fVar5 = ImMax<float>(grab_h_pixels,win_size_v);
    grab_h_norm = ImMax<float>(fVar5,1.0);
    fStack_94 = ImClamp<float>(win_size_avail_v * (win_size_v / grab_h_norm),
                               (pIVar1->Style).GrabMinSize,win_size_avail_v);
    scroll_max = fStack_94 / win_size_avail_v;
    scroll_ratio._3_1_ = 0;
    scroll_ratio._2_1_ = 0;
    scroll_ratio._1_1_ = pIVar1->ActiveId == id_00;
    ButtonBehavior((ImRect *)&bb_height,id_00,(bool *)((long)&scroll_ratio + 2),
                   (bool *)((long)&scroll_ratio + 3),0x2000);
    fVar5 = ImMax<float>(1.0,grab_h_pixels - win_size_v);
    fVar6 = ImSaturate(win_size_contents_v / fVar5);
    mouse_pos_v = (fVar6 * (win_size_avail_v - fStack_94)) / win_size_avail_v;
    if ((((scroll_ratio._3_1_ & 1) != 0) && ((local_6d & 1) != 0)) && (scroll_max < 1.0)) {
      if (bVar3) {
        fVar6 = (pIVar1->IO).MousePos.y;
        local_148 = (ImVec2 *)&(pIVar1->ScrollbarClickDeltaToGrabCenter).y;
        fVar7 = bb_width;
      }
      else {
        fVar6 = (pIVar1->IO).MousePos.x;
        local_148 = &pIVar1->ScrollbarClickDeltaToGrabCenter;
        fVar7 = bb_height;
      }
      fVar6 = ImSaturate((fVar6 - fVar7) / win_size_avail_v);
      SetHoveredID(id_00);
      bVar4 = false;
      if ((scroll_ratio._1_1_ & 1) == 0) {
        if ((fVar6 < mouse_pos_v) || (mouse_pos_v + scroll_max < fVar6)) {
          bVar4 = true;
          local_148->x = 0.0;
        }
        else {
          local_148->x = -scroll_max * 0.5 + (fVar6 - mouse_pos_v);
        }
      }
      grab_rect.Max.y =
           ImSaturate((-scroll_max * 0.5 + (fVar6 - local_148->x)) / (1.0 - scroll_max));
      win_size_contents_v = (float)(int)(grab_rect.Max.y * fVar5 + 0.5);
      if (bVar3) {
        (window_00->Scroll).y = win_size_contents_v;
      }
      else {
        (window_00->Scroll).x = win_size_contents_v;
      }
      fVar5 = ImSaturate(win_size_contents_v / fVar5);
      mouse_pos_v = (fVar5 * (win_size_avail_v - fStack_94)) / win_size_avail_v;
      if (bVar4) {
        local_148->x = -scroll_max * 0.5 + (fVar6 - mouse_pos_v);
      }
    }
    if ((scroll_ratio._3_1_ & 1) == 0) {
      local_14c = 0xf;
      if ((scroll_ratio._2_1_ & 1) != 0) {
        local_14c = 0x10;
      }
    }
    else {
      local_14c = 0x11;
    }
    grab_rect.Max.x = (float)GetColorU32(local_14c,(float)window_rounding_corners);
    ImRect::ImRect((ImRect *)local_d8);
    fVar5 = bb_height;
    if (bVar3) {
      fVar6 = ImLerp<float>(bb_width,bb.Min.y,mouse_pos_v);
      fVar7 = ImLerp<float>(bb_width,bb.Min.y,mouse_pos_v);
      fVar7 = ImMin<float>(fVar7 + fStack_94,host_rect.Min.y);
      ImRect::ImRect(&local_f8,fVar5,fVar6,bb.Min.x,fVar7);
      local_d8._0_4_ = local_f8.Min.x;
      local_d8._4_4_ = local_f8.Min.y;
      grab_rect.Min = local_f8.Max;
    }
    else {
      fVar6 = ImLerp<float>(bb_height,bb.Min.x,mouse_pos_v);
      fVar5 = bb_width;
      fVar7 = ImLerp<float>(bb_height,bb.Min.x,mouse_pos_v);
      fVar7 = ImMin<float>(fVar7 + fStack_94,host_rect.Min.x);
      ImRect::ImRect(&local_e8,fVar6,fVar5,fVar7,bb.Min.y);
      local_d8._0_4_ = local_e8.Min.x;
      local_d8._4_4_ = local_e8.Min.y;
      grab_rect.Min = local_e8.Max;
    }
    ImDrawList::AddRectFilled
              (window_00->DrawList,(ImVec2 *)local_d8,&grab_rect.Min,(ImU32)grab_rect.Max.x,
               (pIVar1->Style).ScrollbarRounding,0xf);
  }
  return;
}

Assistant:

void ImGui::Scrollbar(ImGuiAxis axis)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    const bool horizontal = (axis == ImGuiAxis_X);
    const ImGuiStyle& style = g.Style;
    const ImGuiID id = GetScrollbarID(window, axis);
    KeepAliveID(id);

    // Render background
    bool other_scrollbar = (horizontal ? window->ScrollbarY : window->ScrollbarX);
    float other_scrollbar_size_w = other_scrollbar ? style.ScrollbarSize : 0.0f;
    const ImRect host_rect = window->Rect();
    const float border_size = window->WindowBorderSize;
    ImRect bb = horizontal
        ? ImRect(host_rect.Min.x + border_size, host_rect.Max.y - style.ScrollbarSize, host_rect.Max.x - other_scrollbar_size_w - border_size, host_rect.Max.y - border_size)
        : ImRect(host_rect.Max.x - style.ScrollbarSize, host_rect.Min.y + border_size, host_rect.Max.x - border_size, host_rect.Max.y - other_scrollbar_size_w - border_size);
    bb.Min.x = ImMax(host_rect.Min.x, bb.Min.x); // Handle case where the host rectangle is smaller than the scrollbar
    bb.Min.y = ImMax(host_rect.Min.y, bb.Min.y);
    if (!horizontal)
        bb.Min.y += window->TitleBarHeight() + ((window->Flags & ImGuiWindowFlags_MenuBar) ? window->MenuBarHeight() : 0.0f); // FIXME: InnerRect?

    const float bb_width = bb.GetWidth();
    const float bb_height = bb.GetHeight();
    if (bb_width <= 0.0f || bb_height <= 0.0f)
        return;

    // When we are too small, start hiding and disabling the grab (this reduce visual noise on very small window and facilitate using the resize grab)
    float alpha = 1.0f;
    if ((axis == ImGuiAxis_Y) && bb_height < g.FontSize + g.Style.FramePadding.y * 2.0f)
    {
        alpha = ImSaturate((bb_height - g.FontSize) / (g.Style.FramePadding.y * 2.0f));
        if (alpha <= 0.0f)
            return;
    }
    const bool allow_interaction = (alpha >= 1.0f);

    int window_rounding_corners;
    if (horizontal)
        window_rounding_corners = ImDrawCornerFlags_BotLeft | (other_scrollbar ? 0 : ImDrawCornerFlags_BotRight);
    else
        window_rounding_corners = (((window->Flags & ImGuiWindowFlags_NoTitleBar) && !(window->Flags & ImGuiWindowFlags_MenuBar)) ? ImDrawCornerFlags_TopRight : 0) | (other_scrollbar ? 0 : ImDrawCornerFlags_BotRight);
    window->DrawList->AddRectFilled(bb.Min, bb.Max, GetColorU32(ImGuiCol_ScrollbarBg), window->WindowRounding, window_rounding_corners);
    bb.Expand(ImVec2(-ImClamp((float)(int)((bb_width - 2.0f) * 0.5f), 0.0f, 3.0f), -ImClamp((float)(int)((bb_height - 2.0f) * 0.5f), 0.0f, 3.0f)));

    // V denote the main, longer axis of the scrollbar (= height for a vertical scrollbar)
    float scrollbar_size_v = horizontal ? bb.GetWidth() : bb.GetHeight();
    float scroll_v = horizontal ? window->Scroll.x : window->Scroll.y;
    float win_size_avail_v = (horizontal ? window->SizeFull.x : window->SizeFull.y) - other_scrollbar_size_w;
    float win_size_contents_v = horizontal ? window->SizeContents.x : window->SizeContents.y;

    // Calculate the height of our grabbable box. It generally represent the amount visible (vs the total scrollable amount)
    // But we maintain a minimum size in pixel to allow for the user to still aim inside.
    IM_ASSERT(ImMax(win_size_contents_v, win_size_avail_v) > 0.0f); // Adding this assert to check if the ImMax(XXX,1.0f) is still needed. PLEASE CONTACT ME if this triggers.
    const float win_size_v = ImMax(ImMax(win_size_contents_v, win_size_avail_v), 1.0f);
    const float grab_h_pixels = ImClamp(scrollbar_size_v * (win_size_avail_v / win_size_v), style.GrabMinSize, scrollbar_size_v);
    const float grab_h_norm = grab_h_pixels / scrollbar_size_v;

    // Handle input right away. None of the code of Begin() is relying on scrolling position before calling Scrollbar().
    bool held = false;
    bool hovered = false;
    const bool previously_held = (g.ActiveId == id);
    ButtonBehavior(bb, id, &hovered, &held, ImGuiButtonFlags_NoNavFocus);

    float scroll_max = ImMax(1.0f, win_size_contents_v - win_size_avail_v);
    float scroll_ratio = ImSaturate(scroll_v / scroll_max);
    float grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;
    if (held && allow_interaction && grab_h_norm < 1.0f)
    {
        float scrollbar_pos_v = horizontal ? bb.Min.x : bb.Min.y;
        float mouse_pos_v = horizontal ? g.IO.MousePos.x : g.IO.MousePos.y;
        float* click_delta_to_grab_center_v = horizontal ? &g.ScrollbarClickDeltaToGrabCenter.x : &g.ScrollbarClickDeltaToGrabCenter.y;

        // Click position in scrollbar normalized space (0.0f->1.0f)
        const float clicked_v_norm = ImSaturate((mouse_pos_v - scrollbar_pos_v) / scrollbar_size_v);
        SetHoveredID(id);

        bool seek_absolute = false;
        if (!previously_held)
        {
            // On initial click calculate the distance between mouse and the center of the grab
            if (clicked_v_norm >= grab_v_norm && clicked_v_norm <= grab_v_norm + grab_h_norm)
            {
                *click_delta_to_grab_center_v = clicked_v_norm - grab_v_norm - grab_h_norm*0.5f;
            }
            else
            {
                seek_absolute = true;
                *click_delta_to_grab_center_v = 0.0f;
            }
        }

        // Apply scroll
        // It is ok to modify Scroll here because we are being called in Begin() after the calculation of SizeContents and before setting up our starting position
        const float scroll_v_norm = ImSaturate((clicked_v_norm - *click_delta_to_grab_center_v - grab_h_norm*0.5f) / (1.0f - grab_h_norm));
        scroll_v = (float)(int)(0.5f + scroll_v_norm * scroll_max);//(win_size_contents_v - win_size_v));
        if (horizontal)
            window->Scroll.x = scroll_v;
        else
            window->Scroll.y = scroll_v;

        // Update values for rendering
        scroll_ratio = ImSaturate(scroll_v / scroll_max);
        grab_v_norm = scroll_ratio * (scrollbar_size_v - grab_h_pixels) / scrollbar_size_v;

        // Update distance to grab now that we have seeked and saturated
        if (seek_absolute)
            *click_delta_to_grab_center_v = clicked_v_norm - grab_v_norm - grab_h_norm*0.5f;
    }

    // Render grab
    const ImU32 grab_col = GetColorU32(held ? ImGuiCol_ScrollbarGrabActive : hovered ? ImGuiCol_ScrollbarGrabHovered : ImGuiCol_ScrollbarGrab, alpha);
    ImRect grab_rect;
    if (horizontal)
        grab_rect = ImRect(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm), bb.Min.y, ImMin(ImLerp(bb.Min.x, bb.Max.x, grab_v_norm) + grab_h_pixels, host_rect.Max.x), bb.Max.y);
    else
        grab_rect = ImRect(bb.Min.x, ImLerp(bb.Min.y, bb.Max.y, grab_v_norm), bb.Max.x, ImMin(ImLerp(bb.Min.y, bb.Max.y, grab_v_norm) + grab_h_pixels, host_rect.Max.y));
    window->DrawList->AddRectFilled(grab_rect.Min, grab_rect.Max, grab_col, style.ScrollbarRounding);
}